

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlstring.c
# Opt level: O0

ebml_string * Copy(ebml_string *Element)

{
  char *pcVar1;
  ebml_string *Result;
  ebml_string *Element_local;
  
  Element_local = (ebml_string *)EBML_ElementCreate(Element,(Element->Base).Context,0,-1);
  if (Element_local != (ebml_string *)0x0) {
    pcVar1 = (char *)malloc((Element->Base).DataSize + 1);
    Element_local->Buffer = pcVar1;
    if (Element_local->Buffer == (char *)0x0) {
      NodeDelete((node *)Element_local);
      Element_local = (ebml_string *)0x0;
    }
    else {
      strncpy(Element_local->Buffer,Element->Buffer,(Element->Base).DataSize + 1);
      (Element_local->Base).bValueIsSet = (Element->Base).bValueIsSet;
      (Element_local->Base).DataSize = (Element->Base).DataSize;
      (Element_local->Base).ElementPosition = (Element->Base).ElementPosition;
      (Element_local->Base).SizeLength = (Element->Base).SizeLength;
      (Element_local->Base).SizePosition = (Element->Base).SizePosition;
      (Element_local->Base).EndPosition = (Element->Base).EndPosition;
      (Element_local->Base).bNeedDataSizeUpdate = (Element->Base).bNeedDataSizeUpdate;
    }
  }
  return Element_local;
}

Assistant:

static ebml_string *Copy(const ebml_string *Element)
{
    ebml_string *Result = (ebml_string*)EBML_ElementCreate(Element,Element->Base.Context,0,EBML_ANY_PROFILE);
    if (Result)
    {
        Result->Buffer = malloc(Element->Base.DataSize + 1);
        if (Result->Buffer == NULL)
        {
            NodeDelete((node*)Result);
            return NULL;
        }
        strncpy((char*)Result->Buffer, Element->Buffer, Element->Base.DataSize + 1);
        Result->Base.bValueIsSet = Element->Base.bValueIsSet;
        Result->Base.DataSize = Element->Base.DataSize;
        Result->Base.ElementPosition = Element->Base.ElementPosition;
        Result->Base.SizeLength = Element->Base.SizeLength;
        Result->Base.SizePosition = Element->Base.SizePosition;
        Result->Base.EndPosition = Element->Base.EndPosition;
        Result->Base.bNeedDataSizeUpdate = Element->Base.bNeedDataSizeUpdate;
    }
    return Result;
}